

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O2

void __thiscall RTLsTy::UnregisterLib(RTLsTy *this,__tgt_bin_desc *desc)

{
  __tgt_device_image *p_Var1;
  RTLInfoTy *pRVar2;
  pointer pDVar3;
  pointer ppRVar4;
  int32_t iVar5;
  mapped_type *pmVar6;
  iterator __position;
  long lVar7;
  pointer ppRVar8;
  PendingCtorsDtorsPerLibrary *this_00;
  __tgt_offload_entry *__x;
  int iVar9;
  _List_node_base *p_Var10;
  pthread_mutex_t *__mutex;
  __tgt_bin_desc *desc_local;
  int local_54;
  long local_50;
  PendingCtorsDtorsPerLibrary *local_48;
  pthread_mutex_t *local_40;
  RTLInfoTy *local_38;
  
  desc_local = desc;
  std::mutex::lock(&RTLsMtx);
  lVar7 = 0;
  do {
    ppRVar4 = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (desc->NumDeviceImages <= lVar7) {
      pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
      std::mutex::lock(&TblMapMtx);
      for (__x = desc_local->HostEntriesBegin; __x < desc_local->HostEntriesEnd; __x = __x + 1) {
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_TableMap>,_std::_Select1st<std::pair<void_*const,_TableMap>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_TableMap>_>_>
        ::erase(&HostPtrToTableMap._M_t,&__x->addr);
      }
      __position = std::
                   _Rb_tree<__tgt_offload_entry_*,_std::pair<__tgt_offload_entry_*const,_TranslationTable>,_std::_Select1st<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                   ::find(&HostEntriesBeginToTransTable._M_t,&desc_local->HostEntriesBegin);
      if ((_Rb_tree_header *)__position._M_node !=
          &HostEntriesBeginToTransTable._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<__tgt_offload_entry*,std::pair<__tgt_offload_entry*const,TranslationTable>,std::_Select1st<std::pair<__tgt_offload_entry*const,TranslationTable>>,std::less<__tgt_offload_entry*>,std::allocator<std::pair<__tgt_offload_entry*const,TranslationTable>>>
        ::erase_abi_cxx11_((_Rb_tree<__tgt_offload_entry*,std::pair<__tgt_offload_entry*const,TranslationTable>,std::_Select1st<std::pair<__tgt_offload_entry*const,TranslationTable>>,std::less<__tgt_offload_entry*>,std::allocator<std::pair<__tgt_offload_entry*const,TranslationTable>>>
                            *)&HostEntriesBeginToTransTable,__position);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&TblMapMtx);
      return;
    }
    p_Var1 = desc->DeviceImages;
    ppRVar8 = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_50 = lVar7;
    do {
      if (ppRVar8 == ppRVar4) goto LAB_0010405c;
      pRVar2 = *ppRVar8;
      iVar5 = (*pRVar2->is_valid_binary)(p_Var1 + lVar7);
      ppRVar8 = ppRVar8 + 1;
    } while (iVar5 == 0);
    local_38 = pRVar2;
    for (iVar9 = 0;
        pDVar3 = Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_start, iVar9 < local_38->NumberOfDevices;
        iVar9 = iVar9 + 1) {
      lVar7 = (long)iVar9 + (long)local_38->Idx;
      __mutex = (pthread_mutex_t *)
                &Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7].PendingGlobalsMtx;
      std::mutex::lock((mutex *)&__mutex->__data);
      this_00 = &pDVar3[lVar7].PendingCtorsDtors;
      pmVar6 = std::
               map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
               ::operator[](this_00,&desc_local);
      if ((mapped_type *)
          (pmVar6->PendingCtors).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
          super__List_node_base._M_next == pmVar6) {
        local_54 = iVar9;
        local_48 = this_00;
        local_40 = __mutex;
        pmVar6 = std::
                 map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                 ::operator[](this_00,&desc_local);
        p_Var10 = (_List_node_base *)&pmVar6->PendingDtors;
        while (p_Var10 = (((_List_base<void_*,_std::allocator<void_*>_> *)&p_Var10->_M_next)->
                         _M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != (_List_node_base *)&pmVar6->PendingDtors) {
          target((long)pDVar3[lVar7].DeviceID,p_Var10[1]._M_next,0,(void **)0x0,(void **)0x0,
                 (int64_t *)0x0,(int64_t *)0x0,1,1,1);
        }
        std::
        _Rb_tree<__tgt_bin_desc_*,_std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>,_std::_Select1st<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
        ::erase(&local_48->_M_t,&desc_local);
        __mutex = local_40;
        iVar9 = local_54;
      }
      pthread_mutex_unlock(__mutex);
    }
LAB_0010405c:
    lVar7 = local_50 + 1;
    desc = desc_local;
  } while( true );
}

Assistant:

void RTLsTy::UnregisterLib(__tgt_bin_desc *desc) {
  DP("Unloading target library!\n");

  RTLsMtx.lock();
  // Find which RTL understands each image, if any.
  for (int32_t i = 0; i < desc->NumDeviceImages; ++i) {
    // Obtain the image.
    __tgt_device_image *img = &desc->DeviceImages[i];

    RTLInfoTy *FoundRTL = NULL;

    // Scan the RTLs that have associated images until we find one that supports
    // the current image. We only need to scan RTLs that are already being used.
    for (auto *R : RTLs.UsedRTLs) {

      assert(R->isUsed && "Expecting used RTLs.");

      if (!R->is_valid_binary(img)) {
        DP("Image " DPxMOD " is NOT compatible with RTL " DPxMOD "!\n",
            DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));
        continue;
      }

      DP("Image " DPxMOD " is compatible with RTL " DPxMOD "!\n",
          DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));

      FoundRTL = R;

      // Execute dtors for static objects if the device has been used, i.e.
      // if its PendingCtors list has been emptied.
      for (int32_t i = 0; i < FoundRTL->NumberOfDevices; ++i) {
        DeviceTy &Device = Devices[FoundRTL->Idx + i];
        Device.PendingGlobalsMtx.lock();
        if (Device.PendingCtorsDtors[desc].PendingCtors.empty()) {
          for (auto &dtor : Device.PendingCtorsDtors[desc].PendingDtors) {
            int rc = target(Device.DeviceID, dtor, 0, NULL, NULL, NULL, NULL, 1,
                1, true /*team*/);
            if (rc != OFFLOAD_SUCCESS) {
              DP("Running destructor " DPxMOD " failed.\n", DPxPTR(dtor));
            }
          }
          // Remove this library's entry from PendingCtorsDtors
          Device.PendingCtorsDtors.erase(desc);
        }
        Device.PendingGlobalsMtx.unlock();
      }

      DP("Unregistered image " DPxMOD " from RTL " DPxMOD "!\n",
          DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));

      break;
    }

    // if no RTL was found proceed to unregister the next image
    if (!FoundRTL){
      DP("No RTLs in use support the image " DPxMOD "!\n",
          DPxPTR(img->ImageStart));
    }
  }
  RTLsMtx.unlock();
  DP("Done unregistering images!\n");

  // Remove entries from HostPtrToTableMap
  TblMapMtx.lock();
  for (__tgt_offload_entry *cur = desc->HostEntriesBegin;
      cur < desc->HostEntriesEnd; ++cur) {
    HostPtrToTableMap.erase(cur->addr);
  }

  // Remove translation table for this descriptor.
  auto tt = HostEntriesBeginToTransTable.find(desc->HostEntriesBegin);
  if (tt != HostEntriesBeginToTransTable.end()) {
    DP("Removing translation table for descriptor " DPxMOD "\n",
        DPxPTR(desc->HostEntriesBegin));
    HostEntriesBeginToTransTable.erase(tt);
  } else {
    DP("Translation table for descriptor " DPxMOD " cannot be found, probably "
        "it has been already removed.\n", DPxPTR(desc->HostEntriesBegin));
  }

  TblMapMtx.unlock();

  // TODO: Remove RTL and the devices it manages if it's not used anymore?
  // TODO: Write some RTL->unload_image(...) function?

  DP("Done unregistering library!\n");
}